

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_scratch(ASMState *as,RegSet allow)

{
  Reg RVar1;
  Reg r;
  RegSet allow_local;
  ASMState *as_local;
  
  RVar1 = ra_pick(as,allow);
  as->modset = 1 << ((byte)RVar1 & 0x1f) | as->modset;
  return RVar1;
}

Assistant:

static Reg ra_scratch(ASMState *as, RegSet allow)
{
  Reg r = ra_pick(as, allow);
  ra_modified(as, r);
  RA_DBGX((as, "scratch        $r", r));
  return r;
}